

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

void __thiscall cmBoundsCheckerParser::ParseError(cmBoundsCheckerParser *this,char **atts)

{
  iterator iVar1;
  cmCTest *this_00;
  int iVar2;
  char *pcVar3;
  char *__s2;
  char **ppcVar4;
  int *__args;
  ostringstream cmCTestLog_msg;
  long *local_1b8;
  long local_1a8 [2];
  int local_198 [28];
  ios_base local_128 [264];
  
  pcVar3 = *atts;
  if (pcVar3 == (char *)0x0) {
    __s2 = (char *)0x0;
  }
  else {
    ppcVar4 = atts + 1;
    __s2 = (char *)0x0;
    do {
      iVar2 = strcmp("ErrorCategory",pcVar3);
      if (iVar2 == 0) {
        __s2 = *ppcVar4;
        break;
      }
      pcVar3 = *ppcVar4;
      ppcVar4 = ppcVar4 + 1;
    } while (pcVar3 != (char *)0x0);
  }
  if (__s2 == (char *)0x0) {
    local_198[0] = 1;
    iVar1._M_current =
         (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->Errors,iVar1,local_198);
    }
    else {
      *iVar1._M_current = 1;
      (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar1._M_current + 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"No Category found in Bounds checker XML\n",0x28);
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x60,(char *)local_1b8,false);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  else if (cmCTestMemCheckBoundsChecker[0].ErrorCategory != (char *)0x0) {
    __args = &cmCTestMemCheckBoundsChecker[0].ErrorCode;
    pcVar3 = cmCTestMemCheckBoundsChecker[0].ErrorCategory;
    do {
      iVar2 = strcmp(pcVar3,__s2);
      if (iVar2 == 0) {
        iVar1._M_current =
             (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current !=
            (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *iVar1._M_current = *__args;
          (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          return;
        }
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->Errors,iVar1,__args);
        return;
      }
      pcVar3 = *(char **)(__args + 2);
      __args = __args + 4;
    } while (pcVar3 != (char *)0x0);
  }
  return;
}

Assistant:

void ParseError(const char** atts)
  {
    CatToErrorType* ptr = cmCTestMemCheckBoundsChecker;
    const char* cat = this->GetAttribute("ErrorCategory", atts);
    if (!cat) {
      this->Errors.push_back(cmCTestMemCheckHandler::ABW); // do not know
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "No Category found in Bounds checker XML\n");
      return;
    }
    while (ptr->ErrorCategory && cat) {
      if (strcmp(ptr->ErrorCategory, cat) == 0) {
        this->Errors.push_back(ptr->ErrorCode);
        return; // found it we are done
      }
      ptr++;
    }
    if (ptr->ErrorCategory) {
      this->Errors.push_back(cmCTestMemCheckHandler::ABW); // do not know
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Found unknown Bounds Checker error " << ptr->ErrorCategory
                                                       << std::endl);
    }
  }